

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

QIcon __thiscall QCss::Declaration::iconValue(Declaration *this)

{
  long lVar1;
  Declaration DVar2;
  bool bVar3;
  int iVar4;
  QMetaType QVar5;
  uint uVar6;
  long lVar7;
  long *in_RSI;
  int iVar8;
  Mode mode;
  long lVar9;
  QIcon *other;
  int iVar10;
  long in_FS_OFFSET;
  QIcon moved;
  State local_8c;
  QPixmap local_78;
  Declaration local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = *in_RSI;
  if (*(ulong *)(lVar7 + 0x58) < 4) {
    (this->d).d.ptr = (DeclarationData *)&DAT_aaaaaaaaaaaaaaaa;
    QIcon::QIcon((QIcon *)this);
    iVar8 = 0;
    do {
      if (*(long *)(*in_RSI + 0x38) <= (long)iVar8) break;
      iVar10 = iVar8 + 1;
      uVar6 = 0;
      if (*(int *)(*(long *)(*in_RSI + 0x30) + (long)iVar8 * 0x28) == 7) {
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::toString();
        lVar9 = (long)iVar10;
        iVar8 = iVar8 + 3;
        lVar7 = lVar9 * 0x28 + 8;
        local_8c = Off;
        mode = Normal;
        do {
          if ((lVar9 == *(long *)(*in_RSI + 0x38)) ||
             (lVar1 = *(long *)(*in_RSI + 0x30), *(int *)(lVar1 + -8 + lVar7) != 6)) {
            iVar8 = iVar10 - uVar6;
            break;
          }
          iVar4 = ::QVariant::toInt((bool *)(lVar1 + lVar7));
          switch(iVar4) {
          case 0x51:
            mode = Disabled;
            break;
          case 0x52:
            mode = Active;
            break;
          case 0x53:
            mode = Selected;
            break;
          case 0x54:
            local_8c = On;
            break;
          case 0x55:
            local_8c = Off;
            break;
          default:
            if (iVar4 == 1) {
              mode = Normal;
            }
          }
          lVar9 = lVar9 + 1;
          lVar7 = lVar7 + 0x28;
          bVar3 = uVar6 == 0;
          uVar6 = uVar6 - 1;
        } while (bVar3);
        bVar3 = QIcon::isNull((QIcon *)this);
        if (bVar3) {
          QIcon::QIcon((QIcon *)&local_60,(QString *)&local_58);
          DVar2.d.d.ptr = local_60.d.d.ptr;
          local_60.d.d.ptr =
               (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)
               (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0;
          local_78.super_QPaintDevice._vptr_QPaintDevice = (_func_int **)(this->d).d.ptr;
          (this->d).d.ptr = (DeclarationData *)DVar2;
          QIcon::~QIcon((QIcon *)&local_78);
          QIcon::~QIcon((QIcon *)&local_60);
        }
        else {
          QPixmap::QPixmap(&local_78,(QString *)&local_58,(char *)0x0,(ImageConversionFlags)0x0);
          QIcon::addPixmap((QIcon *)this,&local_78,mode,local_8c);
          QPixmap::~QPixmap(&local_78);
        }
        lVar7 = (long)iVar8;
        bVar3 = *(long *)(*in_RSI + 0x38) != lVar7;
        uVar6 = (uint)bVar3;
        if (bVar3) {
          iVar8 = iVar8 + (uint)(*(int *)(*(long *)(*in_RSI + 0x30) + lVar7 * 0x28) == 0xb);
        }
        iVar10 = iVar8;
        if ((InterfaceType *)local_58.shared != (InterfaceType *)0x0) {
          LOCK();
          *(int *)local_58.shared = *(int *)local_58.shared + -1;
          UNLOCK();
          if (*(int *)local_58.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
          }
        }
      }
      iVar8 = iVar10;
    } while ((char)uVar6 != '\0');
    ::QVariant::QVariant((QVariant *)&local_58,(QMetaType)0x7e2a88,this);
    ::QVariant::operator=((QVariant *)(*in_RSI + 0x40),(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  else {
    other = (QIcon *)(lVar7 + 0x40);
    local_58.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<QIcon>::metaType;
    local_78.super_QPaintDevice._vptr_QPaintDevice =
         (_func_int **)(*(ulong *)(lVar7 + 0x58) & 0xfffffffffffffffc);
    bVar3 = comparesEqual((QMetaType *)&local_78,(QMetaType *)&local_58.shared);
    if (bVar3) {
      if ((*(byte *)(lVar7 + 0x58) & 1) != 0) {
        other = (QIcon *)((long)&other->d->engine + (long)*(int *)((long)&other->d->engine + 4));
      }
      QIcon::QIcon((QIcon *)this,other);
    }
    else {
      (this->d).d.ptr = (DeclarationData *)&DAT_aaaaaaaaaaaaaaaa;
      QIcon::QIcon((QIcon *)this);
      QVar5.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((*(byte *)(lVar7 + 0x58) & 1) != 0) {
        other = (QIcon *)((long)&other->d->engine + (long)*(int *)((long)&other->d->engine + 4));
      }
      QMetaType::convert(QVar5,other,(QMetaType)local_58.shared,this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QIcon)(QIconPrivate *)this;
}

Assistant:

QIcon Declaration::iconValue() const
{
    if (d->parsed.isValid())
        return qvariant_cast<QIcon>(d->parsed);

    QIcon icon;
    for (int i = 0; i < d->values.size();) {
        const Value &value = d->values.at(i++);
        if (value.type != Value::Uri)
            break;
        QString uri = value.variant.toString();
        QIcon::Mode mode = QIcon::Normal;
        QIcon::State state = QIcon::Off;
        for (int j = 0; j < 2; j++) {
            if (i != d->values.size() && d->values.at(i).type == Value::KnownIdentifier) {
                switch (d->values.at(i).variant.toInt()) {
                case Value_Disabled: mode = QIcon::Disabled; break;
                case Value_Active: mode = QIcon::Active; break;
                case Value_Selected: mode = QIcon::Selected; break;
                case Value_Normal: mode = QIcon::Normal; break;
                case Value_On: state = QIcon::On; break;
                case Value_Off: state = QIcon::Off; break;
                default: break;
                }
                ++i;
            } else {
                break;
            }
        }

        // QIcon is soo broken
        if (icon.isNull())
            icon = QIcon(uri);
        else
            icon.addPixmap(uri, mode, state);

        if (i == d->values.size())
            break;

        if (d->values.at(i).type == Value::TermOperatorComma)
            i++;
    }

    d->parsed = QVariant::fromValue<QIcon>(icon);
    return icon;
}